

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_regexp.cc
# Opt level: O0

RegExp * re2c::UTF8Range(Range *r)

{
  uint32_t l;
  uint32_t uVar1;
  RegExp *pRVar2;
  RangeSuffix *local_18;
  RangeSuffix *root;
  Range *r_local;
  
  local_18 = (RangeSuffix *)0x0;
  for (root = (RangeSuffix *)r; root != (RangeSuffix *)0x0;
      root = (RangeSuffix *)Range::next((Range *)root)) {
    l = Range::lower((Range *)root);
    uVar1 = Range::upper((Range *)root);
    UTF8splitByRuneLength(&local_18,l,uVar1 - 1);
  }
  pRVar2 = to_regexp(local_18);
  return pRVar2;
}

Assistant:

RegExp * UTF8Range(const Range * r)
{
	RangeSuffix * root = NULL;
	for (; r != NULL; r = r->next ())
		UTF8splitByRuneLength(root, r->lower (), r->upper () - 1);
	return to_regexp (root);
}